

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcLits.c
# Opt level: O0

int Mvc_CoverIsOneLiteral(Mvc_Cover_t *pCover)

{
  int iVar1;
  Mvc_Cube_t *pMVar2;
  bool bVar3;
  int local_28;
  int Value;
  int Counter;
  int iBit;
  Mvc_Cube_t *pCube;
  Mvc_Cover_t *pCover_local;
  
  iVar1 = Mvc_CoverReadCubeNum(pCover);
  if (iVar1 == 1) {
    pMVar2 = Mvc_CoverReadCubeHead(pCover);
    local_28 = 0;
    for (Value = 0; Value < pCover->nBits; Value = Value + 1) {
      if (((pMVar2->pData[Value >> 5] & 1 << ((byte)Value & 0x1f)) != 0) &&
         (bVar3 = local_28 != 0, local_28 = local_28 + 1, bVar3)) {
        return 0;
      }
    }
    pCover_local._4_4_ = 1;
  }
  else {
    pCover_local._4_4_ = 0;
  }
  return pCover_local._4_4_;
}

Assistant:

int Mvc_CoverIsOneLiteral( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    int iBit, Counter, Value;
    if ( Mvc_CoverReadCubeNum(pCover) != 1 )
        return 0;
    pCube = Mvc_CoverReadCubeHead(pCover);
    // count literals
    Counter = 0;
    Mvc_CubeForEachBit( pCover, pCube, iBit, Value )
    {
        if ( Value )
        {
            if ( Counter++ )
                return 0;
        }
    }
    return 1;
}